

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * Extra_bddComputeRangeCube(DdManager *dd,int iStart,int iStop)

{
  DdNode *n;
  ulong uVar1;
  DdNode *f;
  
  if (iStop < iStart) {
    __assert_fail("iStart <= iStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                  ,0x2bf,"DdNode *Extra_bddComputeRangeCube(DdManager *, int, int)");
  }
  if ((-1 < iStart) && (iStart <= dd->size)) {
    if ((-1 < iStop) && (iStop <= dd->size)) {
      n = dd->one;
      Cudd_Ref(n);
      if (iStart < iStop) {
        uVar1 = (ulong)(uint)iStart;
        f = n;
        do {
          n = Cudd_bddAnd(dd,f,dd->vars[uVar1]);
          Cudd_Ref(n);
          Cudd_RecursiveDeref(dd,f);
          uVar1 = uVar1 + 1;
          f = n;
        } while ((int)uVar1 < iStop);
      }
      Cudd_Deref(n);
      return n;
    }
    __assert_fail("iStop >= 0 && iStop <= dd->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                  ,0x2c1,"DdNode *Extra_bddComputeRangeCube(DdManager *, int, int)");
  }
  __assert_fail("iStart >= 0 && iStart <= dd->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                ,0x2c0,"DdNode *Extra_bddComputeRangeCube(DdManager *, int, int)");
}

Assistant:

DdNode * Extra_bddComputeRangeCube( DdManager * dd, int iStart, int iStop )
{
    DdNode * bTemp, * bProd;
    int i;
    assert( iStart <= iStop );
    assert( iStart >= 0 && iStart <= dd->size );
    assert( iStop >= 0  && iStop  <= dd->size );
    bProd = b1;         Cudd_Ref( bProd );
    for ( i = iStart; i < iStop; i++ )
    {
        bProd = Cudd_bddAnd( dd, bTemp = bProd, dd->vars[i] );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_Deref( bProd );
    return bProd;
}